

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.cpp
# Opt level: O0

vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_> * __thiscall
van_kampen::Diagramm::getCircuit
          (vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>
           *__return_storage_ptr__,Diagramm *this)

{
  bool bVar1;
  nodeId_t nVar2;
  element_type *peVar3;
  deque<van_kampen::Node,_std::allocator<van_kampen::Node>_> *pdVar4;
  const_reference pvVar5;
  deque<van_kampen::Transition,_std::allocator<van_kampen::Transition>_> *pdVar6;
  invalid_argument *this_00;
  const_reference __x;
  reference pvVar7;
  int local_48;
  nodeId_t curNodeId;
  nodeId_t firstNodeId;
  vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_> result;
  Diagramm *this_local;
  
  result.super__Vector_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)this;
  memset(&firstNodeId,0,0x18);
  std::vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>::vector
            ((vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_> *)&firstNodeId
            );
  bVar1 = Node::isNonexistantNode(this->terminal_);
  if (bVar1) {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>::vector
              (__return_storage_ptr__);
  }
  else {
    peVar3 = std::__shared_ptr_access<van_kampen::Graph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<van_kampen::Graph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->graph_);
    pdVar4 = Graph::nodes(peVar3);
    pvVar5 = std::deque<van_kampen::Node,_std::allocator<van_kampen::Node>_>::operator[]
                       (pdVar4,(long)this->terminal_);
    nVar2 = Node::getId(pvVar5);
    local_48 = nVar2;
    do {
      peVar3 = std::__shared_ptr_access<van_kampen::Graph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<van_kampen::Graph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->graph_);
      pdVar4 = Graph::nodes(peVar3);
      pvVar5 = std::deque<van_kampen::Node,_std::allocator<van_kampen::Node>_>::operator[]
                         (pdVar4,(long)local_48);
      pdVar6 = Node::transitions(pvVar5);
      bVar1 = std::deque<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>::empty
                        (pdVar6);
      if (bVar1) {
        this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this_00,"diagram is not looped");
        __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      peVar3 = std::__shared_ptr_access<van_kampen::Graph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<van_kampen::Graph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->graph_);
      pdVar4 = Graph::nodes(peVar3);
      pvVar5 = std::deque<van_kampen::Node,_std::allocator<van_kampen::Node>_>::operator[]
                         (pdVar4,(long)local_48);
      pdVar6 = Node::transitions(pvVar5);
      __x = std::deque<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>::back
                      (pdVar6);
      std::vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>::push_back
                ((vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_> *)
                 &firstNodeId,__x);
      pvVar7 = std::vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>::back
                         ((vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_> *
                          )&firstNodeId);
      local_48 = pvVar7->to;
    } while (local_48 != nVar2);
    std::vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>::vector
              (__return_storage_ptr__,
               (vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_> *)
               &firstNodeId);
  }
  std::vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>::~vector
            ((vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_> *)&firstNodeId
            );
  return __return_storage_ptr__;
}

Assistant:

std::vector<Transition> Diagramm::getCircuit()
{
    std::vector<Transition> result{};

    if (Node::isNonexistantNode(terminal_))
    {
        return {};
    }

    nodeId_t firstNodeId = graph_->nodes()[terminal_].getId();
    nodeId_t curNodeId = firstNodeId;
    do
    {
        if (graph_->nodes()[curNodeId].transitions().empty())
        {
            throw std::invalid_argument("diagram is not looped");
        }
        else
        {
            result.push_back(graph_->nodes()[curNodeId].transitions().back());
            curNodeId = result.back().to;
        }
    } while (curNodeId != firstNodeId);

    return result;
}